

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::HashMap<unsigned_long,_kj::StringPtr>::Entry>::setCapacity
          (Vector<kj::HashMap<unsigned_long,_kj::StringPtr>::Entry> *this,size_t newSize)

{
  StringPtr *__dest;
  size_t __n;
  ArrayBuilder<kj::StringPtr> local_38;
  
  if (newSize < (ulong)((*(long *)(this + 8) - *(long *)this) / 0x18)) {
    *(size_t *)(this + 8) = *(long *)this + newSize * 0x18;
  }
  __dest = _::HeapArrayDisposer::
           allocateUninitialized<kj::HashMap<unsigned_long,kj::StringPtr>::Entry>(newSize);
  local_38.endPtr = (StringPtr *)(newSize * 0x18 + (long)__dest);
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  __n = *(long *)(this + 8) - (long)*(void **)this;
  local_38.ptr = __dest;
  if (__n != 0) {
    memcpy(__dest,*(void **)this,__n);
  }
  local_38.pos = (RemoveConst<kj::StringPtr> *)((long)__dest + __n);
  ArrayBuilder<kj::HashMap<unsigned_long,_kj::StringPtr>::Entry>::operator=
            ((ArrayBuilder<kj::HashMap<unsigned_long,_kj::StringPtr>::Entry> *)this,&local_38);
  ArrayBuilder<kj::HashMap<unsigned_long,_kj::StringPtr>::Entry>::dispose
            ((ArrayBuilder<kj::HashMap<unsigned_long,_kj::StringPtr>::Entry> *)&local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }